

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<bool> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::awaitNextMessage(HttpInputStreamImpl *this)

{
  long *plVar1;
  bool bVar2;
  byte extraout_AL;
  byte extraout_AL_00;
  undefined8 *puVar3;
  Coroutine<bool> *this_00;
  ForkedPromise<void> *promise;
  char *pcVar4;
  size_t sVar5;
  Promise<unsigned_long> *promise_00;
  unsigned_long uVar6;
  ForkedPromise<void> *awaitable;
  ForkedPromiseAwaiter<void> *__return_storage_ptr__;
  size_t *psVar7;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr___00;
  Promise<unsigned_long> *awaitable_00;
  undefined8 in_RSI;
  Array<char> *this_01;
  ArrayPtr<char> AVar8;
  void *pvVar9;
  void *in_stack_fffffffffffff800;
  int local_7b8;
  ForkedPromise<void> local_2a8 [41];
  HttpInputStreamImpl *this_local;
  
  this_local = this;
  puVar3 = (undefined8 *)operator_new(0x650);
  *puVar3 = awaitNextMessage;
  puVar3[1] = awaitNextMessage;
  awaitable = (ForkedPromise<void> *)(puVar3 + 0xc2);
  __return_storage_ptr__ = (ForkedPromiseAwaiter<void> *)(puVar3 + 0x47);
  psVar7 = puVar3 + 0xc5;
  __return_storage_ptr___00 = (PromiseAwaiter<unsigned_long> *)(puVar3 + 0x84);
  awaitable_00 = (Promise<unsigned_long> *)(puVar3 + 0xc6);
  this_00 = (Coroutine<bool> *)(puVar3 + 2);
  puVar3[200] = in_RSI;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar3 + 0xbc),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"awaitNextMessage",0x5d2,0x15);
  pvVar9 = (void *)puVar3[0xbe];
  kj::_::Coroutine<bool>::Coroutine(this_00,*(SourceLocation *)(puVar3 + 0xbc));
  kj::_::Coroutine<bool>::get_return_object((Coroutine<bool> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar2 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar3 + 0x64d));
  if (!bVar2) {
    *(undefined1 *)((long)puVar3 + 0x64c) = 0;
    _GLOBAL__N_1::HttpInputStreamImpl::awaitNextMessage(in_stack_fffffffffffff800,pvVar9);
    return (PromiseBase)(PromiseBase)this;
  }
  std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar3 + 0x64d));
  bVar2 = Maybe<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest>_>::operator==
                    ((Maybe<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest>_> *
                     )(puVar3[200] + 0xa8));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator==
                      ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                       (puVar3[200] + 0xd8));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      SourceLocation::SourceLocation
                ((SourceLocation *)(puVar3 + 0xbf),
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,"awaitNextMessage",0x5e1,0x13);
      pvVar9 = (void *)puVar3[0xc1];
      Promise<void>::fork((Promise<void> *)awaitable);
      ForkedPromise<void>::addBranch(local_2a8);
      Promise<void>::operator=((Promise<void> *)(puVar3[200] + 0xe8),(Promise<void> *)local_2a8);
      Promise<void>::~Promise((Promise<void> *)local_2a8);
      promise = kj::_::Coroutine<bool>::await_transform<kj::ForkedPromise<void>&>(this_00,awaitable)
      ;
      co_await<void>(__return_storage_ptr__,promise);
      bVar2 = kj::_::ForkedPromiseAwaiter<void>::await_ready(__return_storage_ptr__);
      if (!bVar2) {
        *(undefined1 *)((long)puVar3 + 0x64c) = 1;
        _GLOBAL__N_1::HttpInputStreamImpl::awaitNextMessage(in_stack_fffffffffffff800,pvVar9);
        if ((extraout_AL & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      kj::_::ForkedPromiseAwaiter<void>::await_resume(__return_storage_ptr__);
      kj::_::ForkedPromiseAwaiter<void>::~ForkedPromiseAwaiter(__return_storage_ptr__);
      ForkedPromise<void>::~ForkedPromise(awaitable);
    }
    do {
      snarfBufferedLineBreak((HttpInputStreamImpl *)puVar3[200]);
      if (((*(byte *)(puVar3[200] + 0xd0) & 1) == 0) &&
         (bVar2 = ArrayPtr<char>::operator==((ArrayPtr<char> *)(puVar3[200] + 0x38),(void *)0x0),
         ((bVar2 ^ 0xffU) & 1) != 0)) {
        kj::_::CoroutineMixin<kj::_::Coroutine<bool>,_bool>::return_value
                  ((CoroutineMixin<kj::_::Coroutine<bool>,_bool> *)this_00,true);
        goto LAB_0062c6be;
      }
      plVar1 = *(long **)(puVar3[200] + 0x10);
      this_01 = (Array<char> *)(puVar3[200] + 0x18);
      pcVar4 = Array<char>::begin(this_01);
      sVar5 = Array<char>::size(this_01);
      (**(code **)(*plVar1 + 8))(awaitable_00,plVar1,pcVar4,1,sVar5);
      promise_00 = kj::_::Coroutine<bool>::await_transform<kj::Promise<unsigned_long>>
                             (this_00,awaitable_00);
      co_await<unsigned_long>(__return_storage_ptr___00,promise_00);
      bVar2 = kj::_::PromiseAwaiterBase::await_ready
                        ((PromiseAwaiterBase *)__return_storage_ptr___00);
      if (!bVar2) {
        *(undefined1 *)((long)puVar3 + 0x64c) = 2;
        _GLOBAL__N_1::HttpInputStreamImpl::awaitNextMessage(in_stack_fffffffffffff800,pvVar9);
        if ((extraout_AL_00 & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      uVar6 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr___00);
      puVar3[199] = uVar6;
      kj::_::PromiseAwaiter<unsigned_long>::~PromiseAwaiter(__return_storage_ptr___00);
      Promise<unsigned_long>::~Promise(awaitable_00);
      *psVar7 = puVar3[199];
      if (*psVar7 == 0) {
        kj::_::CoroutineMixin<kj::_::Coroutine<bool>,_bool>::return_value
                  ((CoroutineMixin<kj::_::Coroutine<bool>,_bool> *)this_00,false);
        local_7b8 = 3;
      }
      else {
        AVar8 = Array<char>::first((Array<char> *)(puVar3[200] + 0x18),*psVar7);
        *(ArrayPtr<char> *)(puVar3[200] + 0x38) = AVar8;
        local_7b8 = 0;
      }
    } while (local_7b8 == 0);
    if (local_7b8 != 3) goto LAB_0062c7d1;
  }
  else {
    kj::_::CoroutineMixin<kj::_::Coroutine<bool>,_bool>::return_value
              ((CoroutineMixin<kj::_::Coroutine<bool>,_bool> *)this_00,true);
  }
LAB_0062c6be:
  kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
  bVar2 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x64e));
  if (!bVar2) {
    *puVar3 = 0;
    *(undefined1 *)((long)puVar3 + 0x64c) = 3;
    _GLOBAL__N_1::HttpInputStreamImpl::awaitNextMessage(in_stack_fffffffffffff800,pvVar9);
    return (PromiseBase)(PromiseBase)this;
  }
  std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x64e));
LAB_0062c7d1:
  kj::_::Coroutine<bool>::~Coroutine(this_00);
  if (puVar3 != (undefined8 *)0x0) {
    operator_delete(puVar3,0x650);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<bool> awaitNextMessage() override {
    // Waits until more data is available, but doesn't consume it. Returns false on EOF.
    //
    // Used on the server after a request is handled, to check for pipelined requests.
    //
    // Used on the client to detect when idle connections are closed from the server end. (In this
    // case, the promise always returns false or is canceled.)

    if (resumingRequest != kj::none) {
      // We're resuming a request, so report that we have a message.
      co_return true;
    }

    if (onMessageDone != kj::none) {
      // We're still working on reading the previous body.
      auto fork = messageReadQueue.fork();
      messageReadQueue = fork.addBranch();
      co_await fork;
    }

    for (;;) {
      snarfBufferedLineBreak();

      if (!lineBreakBeforeNextHeader && leftover != nullptr) {
        co_return true;
      }

      auto amount = co_await inner.tryRead(headerBuffer.begin(), 1, headerBuffer.size());
      if (amount == 0) {
        co_return false;
      }

      leftover = headerBuffer.first(amount);
    }
  }